

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void state_LOOP(Context *ctx)

{
  if (ctx->source_args[0].regtype != REG_TYPE_LOOP) {
    fail(ctx,"LOOP argument isn\'t loop register");
    return;
  }
  if (ctx->source_args[1].regtype == REG_TYPE_CONSTINT) {
    ctx->loops = ctx->loops + 1;
    return;
  }
  fail(ctx,"LOOP argument isn\'t constint register");
  return;
}

Assistant:

static void state_LOOP(Context *ctx)
{
    if (ctx->source_args[0].regtype != REG_TYPE_LOOP)
        fail(ctx, "LOOP argument isn't loop register");
    else if (ctx->source_args[1].regtype != REG_TYPE_CONSTINT)
        fail(ctx, "LOOP argument isn't constint register");
    else
        ctx->loops++;
}